

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O2

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenEOF(Lexer *this)

{
  Lexer *in_RSI;
  undefined1 local_5a [34];
  long local_38;
  long local_30;
  
  local_5a._0_2_ = 2;
  getCurrentCursor((Position *)(local_5a + 2),in_RSI);
  local_38 = (in_RSI->fileContent)._M_string_length - 1;
  local_5a._26_8_ = local_5a._2_8_;
  local_30 = local_38;
  std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType,pfederc::Position>
            ((Token **)this,(TokenType *)&in_RSI->currentToken,(Position *)local_5a);
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenEOF() noexcept {
  return std::make_unique<Token>(currentToken, TokenType::TOK_EOF, 
    Position{getCurrentCursor().line, getFileContent().length() - 1,
      getFileContent().length() - 1});
}